

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# borromean_impl.h
# Opt level: O0

void secp256k1_borromean_hash
               (uchar *hash,uchar *m,size_t mlen,uchar *e,size_t elen,size_t ridx,size_t eidx)

{
  uint uVar1;
  undefined1 local_a8 [8];
  secp256k1_sha256 sha256_en;
  uint32_t epos;
  uint32_t ring;
  size_t ridx_local;
  size_t elen_local;
  uchar *e_local;
  size_t mlen_local;
  uchar *m_local;
  uchar *hash_local;
  
  secp256k1_sha256_initialize((secp256k1_sha256 *)local_a8);
  uVar1 = (uint)ridx;
  sha256_en.bytes._4_4_ =
       uVar1 << 0x18 | (uVar1 & 0xff00) << 8 | (uVar1 & 0xff0000) >> 8 | uVar1 >> 0x18;
  uVar1 = (uint)eidx;
  sha256_en.bytes._0_4_ =
       uVar1 << 0x18 | (uVar1 & 0xff00) << 8 | (uVar1 & 0xff0000) >> 8 | uVar1 >> 0x18;
  secp256k1_sha256_write((secp256k1_sha256 *)local_a8,e,elen);
  secp256k1_sha256_write((secp256k1_sha256 *)local_a8,m,mlen);
  secp256k1_sha256_write((secp256k1_sha256 *)local_a8,(uchar *)((long)&sha256_en.bytes + 4),4);
  secp256k1_sha256_write((secp256k1_sha256 *)local_a8,(uchar *)&sha256_en.bytes,4);
  secp256k1_sha256_finalize((secp256k1_sha256 *)local_a8,hash);
  return;
}

Assistant:

SECP256K1_INLINE static void secp256k1_borromean_hash(unsigned char *hash, const unsigned char *m, size_t mlen, const unsigned char *e, size_t elen,
 size_t ridx, size_t eidx) {
    uint32_t ring;
    uint32_t epos;
    secp256k1_sha256 sha256_en;
    secp256k1_sha256_initialize(&sha256_en);
    ring = BE32((uint32_t)ridx);
    epos = BE32((uint32_t)eidx);
    secp256k1_sha256_write(&sha256_en, e, elen);
    secp256k1_sha256_write(&sha256_en, m, mlen);
    secp256k1_sha256_write(&sha256_en, (unsigned char*)&ring, 4);
    secp256k1_sha256_write(&sha256_en, (unsigned char*)&epos, 4);
    secp256k1_sha256_finalize(&sha256_en, hash);
}